

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_reference_unittest.cpp
# Opt level: O2

void __thiscall
ArrayReference_from_std_vector_Test::TestBody(ArrayReference_from_std_vector_Test *this)

{
  reference expected;
  char *message;
  initializer_list<int> __l;
  int local_94;
  AssertHelper local_90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertionResult gtest_ar;
  by_value v1;
  stdvec svec;
  
  v1.super_ArrayView<int,_memory::HostCoordinator<int>_>._0_8_ = 0x600000005;
  v1.super_ArrayView<int,_memory::HostCoordinator<int>_>.pointer_ = (pointer)0x800000007;
  v1.super_ArrayView<int,_memory::HostCoordinator<int>_>.size_._0_4_ = 9;
  __l._M_len = 5;
  __l._M_array = (iterator)&v1;
  std::vector<int,_std::allocator<int>_>::vector(&svec,__l,(allocator_type *)&gtest_ar);
  memory::
  Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>::
  Array<int,int,void,void>
            ((Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
              *)&v1,10,0);
  local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
  local_90.data_ = (AssertHelperData *)0xa;
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()((array_reference_type *)&gtest_ar,
               &v1.super_ArrayView<int,_memory::HostCoordinator<int>_>,(size_type *)&local_88,
               (size_type *)&local_90);
  memory::
  ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
  ::operator=((ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
               *)&gtest_ar,&svec);
  local_94 = 5;
  while( true ) {
    if (9 < local_94) break;
    expected = memory::
               ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
               ::operator[](&v1.super_ArrayView<int,_memory::HostCoordinator<int>_>,(long)local_94);
    testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"v1[i]","i",expected,&local_94);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_88);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
                 ,0x3b,message);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_88);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_94 = local_94 + 1;
  }
  memory::
  Array<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~Array(&v1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&svec.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(ArrayReference, from_std_vector) {
    using namespace memory;

    using by_value = Array<int, HostCoordinator<int>>;

    using stdvec = std::vector<int>;

    stdvec svec = {5,6,7,8,9};

    // create range by value of length 10
    by_value v1(10, 0);

    v1(5, 10) = svec;

    for(auto i=5; i<10; ++i)
        EXPECT_EQ(v1[i], i);
}